

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptint.c
# Opt level: O1

int POPT_fprintf(FILE *stream,char *format,...)

{
  long lVar1;
  char in_AL;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  iconv_t __cd;
  size_t sVar7;
  size_t sVar8;
  int *piVar9;
  char *pcVar10;
  size_t sVar11;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint *extraout_RDX;
  ulong uVar12;
  char *pcVar13;
  undefined8 in_R8;
  undefined8 in_R9;
  char **__maxlen;
  ulong uVar14;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *pout;
  char *pin;
  size_t ib;
  va_list ap;
  char *local_138;
  FILE *local_130;
  char *local_128;
  char *local_120;
  size_t local_118;
  size_t local_110 [2];
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pcVar4 = (char *)malloc(2);
  if (pcVar4 == (char *)0x0) {
    return 0;
  }
  __maxlen = (char **)0x1;
  local_130 = (FILE *)stream;
  do {
    local_f8 = local_e8;
    local_110[1] = 0x3000000010;
    pcVar13 = (char *)__maxlen;
    local_100 = &stack0x00000008;
    uVar2 = vsnprintf(pcVar4,(size_t)__maxlen,format,local_110 + 1);
    if ((int)uVar2 < 0) {
      ppcVar5 = (char **)0x64;
      if ((char **)0x64 < __maxlen) {
        ppcVar5 = __maxlen;
      }
      __maxlen = (char **)((long)__maxlen + (long)ppcVar5);
    }
    else {
      ppcVar5 = (char **)(ulong)uVar2;
      if (ppcVar5 < __maxlen) {
        pcVar6 = nl_langinfo(0xe);
        if (pcVar6 != (char *)0x0) {
          pcVar13 = "UTF-8";
          iVar3 = strcmp(pcVar6,"UTF-8");
          if (iVar3 != 0) {
            pcVar13 = "UTF-8";
            __cd = iconv_open(pcVar6,"UTF-8");
            if (__cd != (iconv_t)0xffffffffffffffff) {
              sVar7 = strlen(pcVar4);
              pcVar6 = (char *)malloc(sVar7 + 1);
              local_138 = pcVar6;
              local_128 = pcVar4;
              local_118 = sVar7;
              local_110[0] = sVar7;
              if (pcVar6 == (char *)0x0) {
                iconv_close(__cd);
                pcVar10 = (char *)0x0;
                goto LAB_00107e30;
              }
              iconv(__cd,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
              local_120 = (char *)0x0;
              break;
            }
          }
        }
        sVar7 = strlen(pcVar4);
        sVar7 = sVar7 + 1;
        pcVar10 = (char *)malloc(sVar7);
        uVar2 = (uint)sVar7;
        if (pcVar10 == (char *)0x0) {
          POPT_fprintf_cold_2();
          goto LAB_00107ed9;
        }
        strcpy(pcVar10,pcVar4);
        goto LAB_00107e30;
      }
      __maxlen = (char **)(ulong)(uVar2 + 1);
    }
    pcVar4 = (char *)realloc(pcVar4,(long)__maxlen + 1);
    if (pcVar4 == (char *)0x0) {
      return 0;
    }
  } while( true );
LAB_00107d4f:
  *local_138 = '\0';
  pcVar13 = (char *)&local_128;
  ppcVar5 = &local_138;
  sVar8 = iconv(__cd,(char **)pcVar13,local_110,&local_138,&local_118);
  if (sVar8 == 0xffffffffffffffff) {
    piVar9 = __errno_location();
    pcVar10 = local_138;
    if (*piVar9 != 7) {
LAB_00107e87:
      iconv_close(__cd);
      *local_138 = '\0';
      sVar7 = strlen(pcVar6);
      sVar7 = sVar7 + 1;
      pcVar10 = (char *)malloc(sVar7);
      uVar2 = (uint)sVar7;
      if (pcVar10 == (char *)0x0) {
LAB_00107ed9:
        POPT_fprintf_cold_1();
        iVar3 = -10;
        if ((char **)pcVar13 != (char **)0x0 && 0 < (int)uVar2) {
          sVar7 = (long)(int)uVar2 * 8 + 8;
          uVar12 = (ulong)uVar2;
          uVar14 = 0;
          sVar8 = sVar7;
          do {
            if (*(char **)((long)pcVar13 + uVar14 * 8) == (char *)0x0) {
              return -10;
            }
            sVar11 = strlen(*(char **)((long)pcVar13 + uVar14 * 8));
            sVar8 = sVar8 + sVar11 + 1;
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
          pcVar4 = (char *)malloc(sVar8);
          if (pcVar4 == (char *)0x0) {
            iVar3 = -0x15;
          }
          else {
            pcVar4[sVar7] = '\0';
            if (0 < (int)uVar2) {
              pcVar6 = pcVar4 + sVar7;
              uVar14 = 0;
              do {
                *(char **)(pcVar4 + uVar14 * 8) = pcVar6;
                pcVar6 = stpcpy(pcVar6,*(char **)((long)pcVar13 + uVar14 * 8));
                pcVar6 = pcVar6 + 1;
                uVar14 = uVar14 + 1;
              } while (uVar12 != uVar14);
            }
            pcVar13 = pcVar4 + uVar12 * 8;
            pcVar13[0] = '\0';
            pcVar13[1] = '\0';
            pcVar13[2] = '\0';
            pcVar13[3] = '\0';
            pcVar13[4] = '\0';
            pcVar13[5] = '\0';
            pcVar13[6] = '\0';
            pcVar13[7] = '\0';
            if (ppcVar5 == (char **)0x0) {
              free(pcVar4);
            }
            else {
              *ppcVar5 = pcVar4;
            }
            iVar3 = 0;
            if (extraout_RDX != (uint *)0x0) {
              *extraout_RDX = uVar2;
              iVar3 = 0;
            }
          }
        }
        return iVar3;
      }
      strcpy(pcVar10,pcVar6);
      free(pcVar6);
LAB_00107e30:
      if (pcVar10 == (char *)0x0) {
        iVar3 = fprintf(local_130,"%s",pcVar4);
      }
      else {
        iVar3 = fprintf(local_130,"%s",pcVar10);
        free(pcVar10);
      }
      free(pcVar4);
      return iVar3;
    }
    lVar1 = sVar7 * 2;
    sVar7 = sVar7 * 2;
    pcVar13 = (char *)realloc(pcVar6,lVar1 + 1);
    if (pcVar13 == (char *)0x0) {
      free(pcVar6);
      iconv_close(__cd);
      pcVar10 = (char *)0x0;
      goto LAB_00107e30;
    }
    local_138 = pcVar13 + ((long)pcVar10 - (long)pcVar6);
    local_118 = sVar7 - ((long)pcVar10 - (long)pcVar6);
    pcVar6 = pcVar13;
    goto LAB_00107d4f;
  }
  if (local_120 != (char *)0x0) goto LAB_00107e87;
  local_120 = local_128;
  local_128 = (char *)0x0;
  local_110[0] = 0;
  goto LAB_00107d4f;
}

Assistant:

int
POPT_fprintf (FILE * stream, const char * format, ...)
{
    char * b = NULL, * ob = NULL;
    int rc;
    va_list ap;

#if defined(HAVE_VASPRINTF)
    va_start(ap, format);
    if ((rc = vasprintf(&b, format, ap)) < 0)
	b = NULL;
    va_end(ap);
#else
    size_t nb = (size_t)1;

    /* HACK: add +1 to the realloc no. of bytes "just in case". */
    /* XXX Likely unneeded, the issues wrto vsnprintf(3) return b0rkage have
     * to do with whether the final '\0' is counted (or not). The code
     * below already adds +1 for the (possibly already counted) trailing NUL.
     */
    while ((b = realloc(b, nb+1)) != NULL) {
	va_start(ap, format);
	rc = vsnprintf(b, nb, format, ap);
	va_end(ap);
	if (rc > -1) {	/* glibc 2.1 */
	    if ((size_t)rc < nb)
		break;
	    nb = (size_t)(rc + 1);	/* precise buffer length known */
	} else 		/* glibc 2.0 */
	    nb += (nb < (size_t)100 ? (size_t)100 : nb);
	ob = b;
    }
#endif

    rc = 0;
    if (b != NULL) {
#ifdef HAVE_ICONV
	ob = strdup_locale_from_utf8(b);
	if (ob != NULL) {
	    rc = fprintf(stream, "%s", ob);
	    free(ob);
	} else
#endif
	    rc = fprintf(stream, "%s", b);
	free (b);
    }

    return rc;
}